

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue_p.h
# Opt level: O0

QCborValueConstRef __thiscall
QCborContainerPrivate::findCborMapKey<long_long>(QCborContainerPrivate *this,longlong key)

{
  QCborValueConstRef QVar1;
  qsizetype qVar2;
  const_reference pEVar3;
  long in_RSI;
  QCborContainerPrivate *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  bool equals;
  Element *e;
  qsizetype i;
  qsizetype in_stack_ffffffffffffff98;
  QList<QtCbor::Element> *in_stack_ffffffffffffffa0;
  long local_30;
  QCborValueConstRef local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  for (local_30 = 0; qVar2 = QList<QtCbor::Element>::size(&in_RDI->elements), local_30 < qVar2;
      local_30 = local_30 + 2) {
    pEVar3 = QList<QtCbor::Element>::at(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    bVar4 = false;
    if (pEVar3->type == Integer) {
      bVar4 = (pEVar3->field_0).value == in_RSI;
    }
    if (bVar4) break;
  }
  QCborValueConstRef::QCborValueConstRef(&local_18,in_RDI,local_30 + 1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  QVar1.i = local_18.i;
  QVar1.d = local_18.d;
  return QVar1;
}

Assistant:

QCborValueConstRef findCborMapKey(KeyType key)
    {
        qsizetype i = 0;
        for ( ; i < elements.size(); i += 2) {
            const auto &e = elements.at(i);
            bool equals;
            if constexpr (std::is_same_v<std::decay_t<KeyType>, QCborValue>) {
                equals = (compareElement(i, key, QtCbor::Comparison::ForEquality) == 0);
            } else if constexpr (std::is_integral_v<KeyType>) {
                equals = (e.type == QCborValue::Integer && e.value == key);
            } else {
                // assume it's a string
                equals = stringEqualsElement(i, key);
            }
            if (equals)
                break;
        }
        return { this, i + 1 };
    }